

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriter::writeAttribute
          (QXmlStreamWriter *this,QAnyStringView qualifiedName,QAnyStringView value)

{
  QAnyStringView s;
  QXmlStreamWriterPrivate *this_00;
  char *str;
  QAnyStringView *this_01;
  size_t in_RCX;
  size_t __n;
  Tag *in_RDX;
  qsizetype in_RSI;
  qsizetype in_R8;
  long in_FS_OFFSET;
  QXmlStreamWriterPrivate *d;
  qsizetype in_stack_fffffffffffffef0;
  int *len;
  char *in_stack_fffffffffffffef8;
  QAnyStringView *in_stack_ffffffffffffff00;
  QXmlStreamWriterPrivate *this_02;
  undefined1 escapeWhitespace;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  size_t in_stack_ffffffffffffff68;
  int local_78 [2];
  void *local_70;
  size_t local_68;
  qsizetype qStack_60;
  int local_58;
  void *local_50;
  qsizetype local_48;
  Tag *pTStack_40;
  int local_38;
  void *local_30;
  size_t local_28;
  qsizetype qStack_20;
  qsizetype local_18;
  Tag *pTStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RCX;
  qStack_20 = in_R8;
  local_18 = in_RSI;
  pTStack_10 = in_RDX;
  this_00 = d_func((QXmlStreamWriter *)0x64e33b);
  aVar1.m_data = &stack0xffffffffffffffc8;
  escapeWhitespace = 0;
  std::data<char_const,2ul>((char (*) [2])0x91a05b);
  QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64e386);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  QXmlStreamWriterPrivate::write(this_00,local_38,local_30,in_RCX);
  local_48 = local_18;
  pTStack_40 = pTStack_10;
  QXmlStreamWriterPrivate::write(this_00,(int)local_18,pTStack_10,in_RCX);
  this_02 = (QXmlStreamWriterPrivate *)&stack0xffffffffffffffa8;
  std::data<char_const,3ul>((char (*) [3])0x93071d);
  QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x64e446);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  QXmlStreamWriterPrivate::write(this_00,local_58,local_50,in_RCX);
  local_68 = local_28;
  qStack_60 = qStack_20;
  __n = 1;
  s.m_size = in_stack_ffffffffffffff68;
  s.field_0.m_data = aVar1.m_data;
  QXmlStreamWriterPrivate::writeEscaped(this_02,s,(bool)escapeWhitespace);
  len = local_78;
  str = std::data<char_const,2ul>((char (*) [2])0x92e5dd);
  this_01 = (QAnyStringView *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64e50a);
  QAnyStringView::QAnyStringView<char,_true>(this_01,str,(qsizetype)len);
  QXmlStreamWriterPrivate::write(this_00,local_78[0],local_70,__n);
  *(ushort *)&this_00->field_0x78 = *(ushort *)&this_00->field_0x78 | 0x200;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeAttribute(QAnyStringView qualifiedName, QAnyStringView value)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(d->inStartElement);
    Q_ASSERT(count(qualifiedName, ':') <= 1);
    d->write(" ");
    d->write(qualifiedName);
    d->write("=\"");
    d->writeEscaped(value, true);
    d->write("\"");
    d->didWriteAnyToken = true;
}